

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

bool __thiscall Json::OurReader::readComment(OurReader *this)

{
  bool bVar1;
  char *pcVar2;
  CommentPlacement placement;
  Location pCVar3;
  char *pcVar4;
  Char CVar5;
  bool bVar6;
  
  pCVar3 = this->current_;
  if (pCVar3 == this->end_) {
    CVar5 = '\0';
  }
  else {
    this->current_ = pCVar3 + 1;
    CVar5 = *pCVar3;
  }
  if (CVar5 == '/') {
    readCppStyleComment(this);
    bVar1 = true;
  }
  else if (CVar5 == '*') {
    bVar1 = readCStyleComment(this);
  }
  else {
    bVar1 = false;
  }
  if (bVar1 == false) {
    return bVar1;
  }
  if (this->collectComments_ != true) {
    return bVar1;
  }
  pCVar3 = pCVar3 + -1;
  pcVar2 = this->lastValueEnd_;
  placement = commentBefore;
  if (pcVar2 != (char *)0x0) {
    bVar6 = pcVar2 < pCVar3;
    if (bVar6) {
      do {
        if ((*pcVar2 == '\n') || (*pcVar2 == '\r')) break;
        pcVar2 = pcVar2 + 1;
        bVar6 = pcVar2 < pCVar3;
      } while (pcVar2 != pCVar3);
    }
    placement = commentBefore;
    if (!bVar6) {
      if (CVar5 == '*') {
        pcVar2 = this->current_;
        bVar6 = pCVar3 < pcVar2;
        pcVar4 = pCVar3;
        if (bVar6) {
          do {
            if ((*pcVar4 == '\n') || (*pcVar4 == '\r')) break;
            pcVar4 = pcVar4 + 1;
            bVar6 = pcVar4 < pcVar2;
          } while (pcVar4 != pcVar2);
        }
        placement = commentBefore;
        if (bVar6) goto LAB_00108637;
      }
      placement = commentAfterOnSameLine;
    }
  }
LAB_00108637:
  addComment(this,pCVar3,this->current_,placement);
  return bVar1;
}

Assistant:

bool OurReader::readComment() {
  Location commentBegin = current_ - 1;
  Char c = getNextChar();
  bool successful = false;
  if (c == '*')
    successful = readCStyleComment();
  else if (c == '/')
    successful = readCppStyleComment();
  if (!successful)
    return false;

  if (collectComments_) {
    CommentPlacement placement = commentBefore;
    if (lastValueEnd_ && !containsNewLine(lastValueEnd_, commentBegin)) {
      if (c != '*' || !containsNewLine(commentBegin, current_))
        placement = commentAfterOnSameLine;
    }

    addComment(commentBegin, current_, placement);
  }
  return true;
}